

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::create(Mat *this,int _w,size_t _elemsize,int _elempack,Allocator *_allocator)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  long in_R8;
  size_t totalsize;
  void *ptr;
  void *local_18;
  long local_10;
  void *local_8;
  
  if (((((int)in_RDI[5] != 1) || (*(int *)((long)in_RDI + 0x2c) != in_ESI)) || (in_RDI[2] != in_RDX)
      ) || (((int)in_RDI[3] != in_ECX || (in_RDI[4] != in_R8)))) {
    if (in_RDI[1] != 0) {
      piVar1 = (int *)in_RDI[1];
      LOCK();
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        if (in_RDI[4] == 0) {
          local_8 = (void *)*in_RDI;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(*(long *)in_RDI[4] + 0x18))((long *)in_RDI[4],*in_RDI);
        }
      }
    }
    *in_RDI = 0;
    in_RDI[2] = 0;
    *(undefined4 *)(in_RDI + 3) = 0;
    *(undefined4 *)(in_RDI + 5) = 0;
    *(undefined4 *)((long)in_RDI + 0x2c) = 0;
    *(undefined4 *)(in_RDI + 6) = 0;
    *(undefined4 *)((long)in_RDI + 0x34) = 0;
    *(undefined4 *)(in_RDI + 7) = 0;
    in_RDI[8] = 0;
    in_RDI[1] = 0;
    in_RDI[2] = in_RDX;
    *(int *)(in_RDI + 3) = in_ECX;
    in_RDI[4] = in_R8;
    *(undefined4 *)(in_RDI + 5) = 1;
    *(int *)((long)in_RDI + 0x2c) = in_ESI;
    *(undefined4 *)(in_RDI + 6) = 1;
    *(undefined4 *)((long)in_RDI + 0x34) = 1;
    *(undefined4 *)(in_RDI + 7) = 1;
    in_RDI[8] = (long)*(int *)((long)in_RDI + 0x2c);
    uVar3 = in_RDI[8] * (long)(int)in_RDI[7] * in_RDI[2] + 3U & 0xfffffffffffffffc;
    if (uVar3 != 0) {
      if (in_RDI[4] == 0) {
        local_10 = uVar3 + 4;
        local_18 = (void *)0x0;
        iVar2 = posix_memalign(&local_18,0x40,uVar3 + 0x44);
        if (iVar2 != 0) {
          local_18 = (void *)0x0;
        }
        *in_RDI = (long)local_18;
      }
      else {
        lVar4 = (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],uVar3 + 4);
        *in_RDI = lVar4;
      }
    }
    if (*in_RDI != 0) {
      in_RDI[1] = *in_RDI + uVar3;
      *(undefined4 *)in_RDI[1] = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, size_t _elemsize, int _elempack, Allocator* _allocator)
{
    if (dims == 1 && w == _w && elemsize == _elemsize && elempack == _elempack && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = _elempack;
    allocator = _allocator;

    dims = 1;
    w = _w;
    h = 1;
    d = 1;
    c = 1;

    cstep = w;

    size_t totalsize = alignSize(total() * elemsize, 4);
    if (totalsize > 0)
    {
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
    }

    if (data)
    {
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}